

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXCount.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  int iVar1;
  ostream *poVar2;
  SAXParser *this;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  MemoryManager *pMVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  SAXCountHandlers handler;
  char localeStr [64];
  ifstream fin;
  char fURI [1000];
  undefined1 auStack_6e8 [4];
  uint local_6e4;
  uint local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  char **local_6d0;
  uint local_6c8;
  int local_6c4;
  char *local_6b8;
  SAXCountHandlers local_6b0;
  char local_668 [72];
  long local_620 [4];
  byte abStack_600 [488];
  char local_418 [1000];
  
  local_6d0 = argV;
  if (1 < argC) {
    local_6b8 = local_668;
    local_668[0x30] = '\0';
    local_668[0x31] = '\0';
    local_668[0x32] = '\0';
    local_668[0x33] = '\0';
    local_668[0x34] = '\0';
    local_668[0x35] = '\0';
    local_668[0x36] = '\0';
    local_668[0x37] = '\0';
    local_668[0x38] = '\0';
    local_668[0x39] = '\0';
    local_668[0x3a] = '\0';
    local_668[0x3b] = '\0';
    local_668[0x3c] = '\0';
    local_668[0x3d] = '\0';
    local_668[0x3e] = '\0';
    local_668[0x3f] = '\0';
    local_668[0x20] = '\0';
    local_668[0x21] = '\0';
    local_668[0x22] = '\0';
    local_668[0x23] = '\0';
    local_668[0x24] = '\0';
    local_668[0x25] = '\0';
    local_668[0x26] = '\0';
    local_668[0x27] = '\0';
    local_668[0x28] = '\0';
    local_668[0x29] = '\0';
    local_668[0x2a] = '\0';
    local_668[0x2b] = '\0';
    local_668[0x2c] = '\0';
    local_668[0x2d] = '\0';
    local_668[0x2e] = '\0';
    local_668[0x2f] = '\0';
    local_668[0x10] = '\0';
    local_668[0x11] = '\0';
    local_668[0x12] = '\0';
    local_668[0x13] = '\0';
    local_668[0x14] = '\0';
    local_668[0x15] = '\0';
    local_668[0x16] = '\0';
    local_668[0x17] = '\0';
    local_668[0x18] = '\0';
    local_668[0x19] = '\0';
    local_668[0x1a] = '\0';
    local_668[0x1b] = '\0';
    local_668[0x1c] = '\0';
    local_668[0x1d] = '\0';
    local_668[0x1e] = '\0';
    local_668[0x1f] = '\0';
    local_668[0] = '\0';
    local_668[1] = '\0';
    local_668[2] = '\0';
    local_668[3] = '\0';
    local_668[4] = '\0';
    local_668[5] = '\0';
    local_668[6] = '\0';
    local_668[7] = '\0';
    local_668[8] = '\0';
    local_668[9] = '\0';
    local_668[10] = '\0';
    local_668[0xb] = '\0';
    local_668[0xc] = '\0';
    local_668[0xd] = '\0';
    local_668[0xe] = '\0';
    local_668[0xf] = '\0';
    local_6e4 = 2;
    iVar10 = 0;
    uVar8 = 1;
    local_6d4 = 0;
    local_6d8 = 0;
    local_6dc = 0;
    local_6e0 = 0;
    local_6c8 = 0;
    local_6c4 = argC;
    do {
      pcVar5 = local_6d0[uVar8];
      uVar9 = uVar8;
      if (*pcVar5 != '-') break;
      iVar1 = strcmp(pcVar5,"-?");
      if (iVar1 == 0) {
        usage();
        return 2;
      }
      iVar1 = strncmp(pcVar5,"-v=",3);
      if ((iVar1 == 0) || (iVar1 = strncmp(pcVar5,"-V=",3), iVar1 == 0)) {
        pcVar5 = pcVar5 + 3;
        iVar1 = strcmp(pcVar5,"never");
        bVar7 = true;
        if (iVar1 == 0) {
          local_6e4 = 0;
        }
        else {
          iVar1 = strcmp(pcVar5,"auto");
          if (iVar1 == 0) {
            local_6e4 = 2;
          }
          else {
            iVar1 = strcmp(pcVar5,"always");
            if (iVar1 == 0) {
              local_6e4 = 1;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar3 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3)
              ;
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
              std::ostream::put(-0x48);
              std::ostream::flush();
              iVar10 = 2;
              bVar7 = false;
            }
          }
        }
        if (!bVar7) {
          return iVar10;
        }
      }
      else {
        iVar1 = strcmp(pcVar5,"-n");
        if ((iVar1 == 0) || (iVar1 = strcmp(pcVar5,"-N"), iVar1 == 0)) {
          local_6d4 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
        }
        else {
          iVar1 = strcmp(pcVar5,"-s");
          if ((iVar1 == 0) || (iVar1 = strcmp(pcVar5,"-S"), iVar1 == 0)) {
            local_6d8 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
          }
          else {
            iVar1 = strcmp(pcVar5,"-f");
            if ((iVar1 == 0) || (iVar1 = strcmp(pcVar5,"-F"), iVar1 == 0)) {
              local_6dc = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
            }
            else {
              iVar1 = strcmp(pcVar5,"-l");
              if ((iVar1 == 0) || (iVar1 = strcmp(pcVar5,"-L"), iVar1 == 0)) {
                local_6e0 = (uint)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
              }
              else {
                iVar1 = strcmp(pcVar5,"-special:nel");
                if (iVar1 == 0) {
                  local_6c8 = 1;
                }
                else {
                  iVar1 = strncmp(pcVar5,"-locale=",8);
                  if (iVar1 == 0) {
                    strcpy(local_668,pcVar5 + 8);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Unknown option \'",0x10);
                    poVar2 = std::operator<<((ostream *)&std::cerr,local_6d0[uVar8]);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar2,"\', ignoring it\n",0xf);
                    std::endl<char,std::char_traits<char>>(poVar2);
                  }
                }
              }
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
      uVar9 = (ulong)(uint)argC;
    } while ((uint)argC != uVar8);
    if ((int)uVar9 != local_6c4) {
      if (local_668[0] == '\0') {
        local_6b8 = (char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
      }
      pMVar6 = (MemoryManager *)0x0;
      xercesc_4_0::XMLPlatformUtils::Initialize
                (local_6b8,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
      if ((local_6c8 & 1) != 0) {
        pMVar6 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
        xercesc_4_0::XMLPlatformUtils::recognizeNEL
                  (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pMVar6);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      bVar7 = SUB81(this,0);
      xercesc_4_0::SAXParser::setDoNamespaces(bVar7);
      xercesc_4_0::SAXParser::setDoSchema(bVar7);
      xercesc_4_0::SAXParser::setHandleMultipleImports(bVar7);
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar7);
      SAXCountHandlers::SAXCountHandlers(&local_6b0);
      (**(code **)(*(long *)this + 0x20))(this,&local_6b0.super_HandlerBase.super_DocumentHandler);
      (**(code **)(*(long *)this + 0x28))(this);
      std::ifstream::ifstream(local_620);
      if ((local_6e0 & 1) != 0) {
        std::ifstream::open((char *)local_620,(_Ios_Openmode)local_6d0[uVar9 & 0xffffffff]);
      }
      if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 5) == 0) {
        local_6e4 = 0;
        do {
          memset(local_418,0,1000);
          if ((local_6e0 & 1) == 0) {
            bVar7 = true;
            iVar10 = (int)uVar9;
            if (iVar10 < local_6c4) {
              pcVar5 = local_6d0[iVar10];
              uVar9 = (ulong)(iVar10 + 1);
LAB_00103a8c:
              SAXCountHandlers::resetErrors(&local_6b0);
              xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
              (**(code **)(*(long *)this + 0x40))(this);
              uVar4 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
              if (local_6b0.fSawErrors == false) {
                if (pcVar5 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109098);
                }
                else {
                  sVar3 = strlen(pcVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar5,sVar3);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," ms (",5);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," elems, ",8);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," attrs, ",8);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," spaces, ",9);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," chars)",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                std::ostream::put((char)poVar2);
                std::ostream::flush();
              }
              else {
                local_6e4 = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
              goto LAB_00103bfb;
            }
          }
          else {
            bVar7 = true;
            if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 2) == 0) {
              std::ios::widen((char)auStack_6e8 + (char)*(long *)(local_620[0] + -0x18) + -0x38);
              std::istream::getline((char *)local_620,(long)local_418,-0x18);
              if (local_418[0] != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"==Parsing== ",0xc);
                sVar3 = strlen(local_418);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_418,sVar3);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
                std::ostream::put(-0x48);
                std::ostream::flush();
                pcVar5 = local_418;
                goto LAB_00103a8c;
              }
LAB_00103bfb:
              bVar7 = false;
            }
          }
        } while (!bVar7);
        if ((local_6e0 & 1) != 0) {
          std::ifstream::close();
        }
        (**(code **)(*(long *)this + 8))(this);
        xercesc_4_0::XMLPlatformUtils::Terminate();
        iVar10 = (local_6e4 & 1) << 2;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
        pcVar5 = local_6d0[uVar9 & 0xffffffff];
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1091b8);
        }
        else {
          sVar3 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
        std::ostream::put(-0x48);
        iVar10 = 2;
        std::ostream::flush();
      }
      std::ifstream::~ifstream(local_620);
      SAXCountHandlers::~SAXCountHandlers(&local_6b0);
      return iVar10;
    }
  }
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    const char*              xmlFile = 0;
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool                     doNamespaces       = false;
    bool                     doSchema           = false;
    bool                     schemaFullChecking = false;
    bool                     doList = false;
    bool                     errorOccurred = false;
    bool                     recognizeNEL = false;
    char                     localeStr[64];
    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }
    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler.
    //
    SAXCountHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);


    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        //reset error count first
        handler.resetErrors();

        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(xmlFile);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorOccurred = true;
            continue;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
            errorOccurred = true;
            continue;
        }

        catch (...)
        {
            std::cerr << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
            errorOccurred = true;
            continue;
        }


        // Print out the stats that we collected and time taken
        if (!handler.getSawErrors())
        {
            std::cout << xmlFile << ": " << duration << " ms ("
                << handler.getElementCount() << " elems, "
                << handler.getAttrCount() << " attrs, "
                << handler.getSpaceCount() << " spaces, "
                << handler.getCharacterCount() << " chars)" << std::endl;
        }
        else
            errorOccurred = true;
    }

    if (doList)
        fin.close();

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}